

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProceduralBlockVisitor.hpp
# Opt level: O1

void __thiscall
netlist::ProceduralBlockVisitor::handle(ProceduralBlockVisitor *this,ForLoopStatement *loop)

{
  EvalContext *this_00;
  size_t sVar1;
  VariableSymbol *symbol;
  pointer ppVVar2;
  pointer ppEVar3;
  undefined1 *puVar4;
  __index_type _Var5;
  char cVar6;
  bool bVar7;
  Expression *this_01;
  long lVar8;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  *this_02;
  int iVar9;
  long lVar10;
  ulong uVar11;
  pointer ppVVar12;
  long lVar13;
  SmallVector<slang::ConstantValue_*,_5UL> localPtrs;
  SmallVector<slang::ConstantValue,_16UL> values;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_388;
  undefined8 local_368;
  pointer local_360;
  undefined1 *local_358;
  long local_350;
  undefined8 local_348;
  undefined1 local_340 [40];
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_318;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_2f0;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_2c8;
  char local_2a8;
  
  if ((((this->options->unrollForLoops != true) ||
       (sVar1 = (loop->loopVars)._M_extent._M_extent_value, sVar1 == 0)) ||
      (loop->stopExpr == (Expression *)0x0)) ||
     (((loop->steps)._M_extent._M_extent_value == 0 || (this->anyErrors == true)))) {
    slang::ast::Statement::visit<netlist::ProceduralBlockVisitor&>(loop->body,this);
    return;
  }
  local_358 = local_340;
  local_350 = 0;
  local_348 = 5;
  ppVVar12 = (loop->loopVars)._M_ptr;
  local_360 = ppVVar12 + sVar1;
  this_00 = &this->evalCtx;
  do {
    symbol = *ppVVar12;
    this_01 = slang::ast::DeclaredType::getInitializer(&(symbol->super_ValueSymbol).declaredType);
    if (this_01 == (Expression *)0x0) {
      sVar1 = (loop->loopVars)._M_extent._M_extent_value;
      if (sVar1 != 0) {
        ppVVar12 = (loop->loopVars)._M_ptr;
        lVar8 = 0;
        do {
          slang::ast::EvalContext::deleteLocal(this_00,*(ValueSymbol **)((long)ppVVar12 + lVar8));
          lVar8 = lVar8 + 8;
        } while (sVar1 << 3 != lVar8);
      }
      slang::ast::Statement::visit<netlist::ProceduralBlockVisitor&>(loop->body,this);
      goto LAB_00177e83;
    }
    slang::ast::Expression::eval((ConstantValue *)&local_2c8,this_01,this_00);
    cVar6 = local_2a8;
    if (local_2a8 == '\0') {
      sVar1 = (loop->loopVars)._M_extent._M_extent_value;
      if (sVar1 != 0) {
        ppVVar2 = (loop->loopVars)._M_ptr;
        lVar8 = 0;
        do {
          slang::ast::EvalContext::deleteLocal(this_00,*(ValueSymbol **)((long)ppVVar2 + lVar8));
          lVar8 = lVar8 + 8;
        } while (sVar1 << 3 != lVar8);
      }
      this_02 = (_Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                 *)this;
      slang::ast::Statement::visit<netlist::ProceduralBlockVisitor&>(loop->body,this);
    }
    else {
      std::__detail::__variant::
      _Move_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::_Move_ctor_base((_Move_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                         *)(local_340 + 0x28),
                        (_Move_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                         *)&local_2c8);
      local_388._0_8_ =
           slang::ast::EvalContext::createLocal
                     (this_00,&symbol->super_ValueSymbol,(ConstantValue *)(local_340 + 0x28));
      this_02 = &local_388;
      slang::SmallVectorBase<slang::ConstantValue*>::emplace_back<slang::ConstantValue*>
                ((SmallVectorBase<slang::ConstantValue*> *)&local_358,(ConstantValue **)this_02);
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           *)(local_340 + 0x28));
    }
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                         *)&local_2c8);
    if (cVar6 == '\0') goto LAB_00177e83;
    ppVVar12 = ppVVar12 + 1;
  } while (ppVVar12 != local_360);
  local_2c8._0_8_ = (long)&local_2c8 + 0x18;
  local_2c8._8_8_ = 0;
  local_2c8._16_8_ = 0x10;
LAB_00177be8:
  if (this->anyErrors == false) {
    this_02 = (_Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               *)0xffffffffffffffff;
    bVar7 = slang::ast::EvalContext::step(this_00,(SourceLocation)0xffffffffffffffff);
    if (!bVar7) goto LAB_00177c14;
    this_02 = (_Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               *)loop->stopExpr;
    slang::ast::Expression::eval((ConstantValue *)&local_388,(Expression *)this_02,this_00);
  }
  else {
LAB_00177c14:
    this->anyErrors = true;
    local_388._16_8_ = 0;
    local_388._24_8_ = 0;
    local_388._0_8_ = (ConstantValue *)0x0;
    local_388._8_8_ = 0;
    local_368 = 0;
  }
  if ((char)local_368 == '\0') {
    sVar1 = (loop->loopVars)._M_extent._M_extent_value;
    if (sVar1 != 0) {
      ppVVar12 = (loop->loopVars)._M_ptr;
      lVar8 = 0;
      do {
        slang::ast::EvalContext::deleteLocal(this_00,*(ValueSymbol **)((long)ppVVar12 + lVar8));
        lVar8 = lVar8 + 8;
      } while (sVar1 << 3 != lVar8);
    }
    iVar9 = 1;
    this_02 = (_Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               *)this;
    slang::ast::Statement::visit<netlist::ProceduralBlockVisitor&>(loop->body,this);
  }
  else {
    bVar7 = slang::ConstantValue::isTrue((ConstantValue *)&local_388);
    puVar4 = local_358;
    iVar9 = 5;
    if (bVar7) {
      if (local_350 != 0) {
        lVar8 = local_350 << 3;
        lVar10 = 0;
        do {
          this_02 = *(_Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                      **)(puVar4 + lVar10);
          slang::SmallVectorBase<slang::ConstantValue>::emplace_back<slang::ConstantValue&>
                    ((SmallVectorBase<slang::ConstantValue> *)&local_2c8,(ConstantValue *)this_02);
          lVar10 = lVar10 + 8;
        } while (lVar8 != lVar10);
      }
      sVar1 = (loop->steps)._M_extent._M_extent_value;
      iVar9 = 0;
      if (sVar1 != 0) {
        ppEVar3 = (loop->steps)._M_ptr;
        lVar8 = 0;
LAB_00177c97:
        this_02 = *(_Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                    **)((long)ppEVar3 + lVar8);
        slang::ast::Expression::eval((ConstantValue *)&local_2f0,(Expression *)this_02,this_00);
        _Var5 = local_2f0._M_index;
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage(&local_2f0);
        if (_Var5 != '\0') goto code_r0x00177cc3;
        sVar1 = (loop->loopVars)._M_extent._M_extent_value;
        if (sVar1 != 0) {
          ppVVar12 = (loop->loopVars)._M_ptr;
          lVar8 = 0;
          do {
            slang::ast::EvalContext::deleteLocal(this_00,*(ValueSymbol **)((long)ppVVar12 + lVar8));
            lVar8 = lVar8 + 8;
          } while (sVar1 << 3 != lVar8);
        }
        iVar9 = 1;
        this_02 = (_Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   *)this;
        slang::ast::Statement::visit<netlist::ProceduralBlockVisitor&>(loop->body,this);
      }
    }
  }
  goto LAB_00177d94;
code_r0x00177cc3:
  lVar8 = lVar8 + 8;
  if (sVar1 << 3 == lVar8) goto code_r0x00177ccc;
  goto LAB_00177c97;
code_r0x00177ccc:
  iVar9 = 0;
LAB_00177d94:
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       *)&local_388);
  if (iVar9 != 0) goto code_r0x00177da5;
  goto LAB_00177be8;
code_r0x00177da5:
  if (iVar9 == 5) {
    uVar11 = 0;
    do {
      puVar4 = local_358;
      if ((ulong)local_2c8._8_8_ <= uVar11) break;
      if (local_350 != 0) {
        lVar10 = local_350 << 3;
        lVar8 = uVar11 * 0x28;
        lVar13 = 0;
        do {
          local_388._0_8_ = *(undefined8 *)(puVar4 + lVar13);
          (*std::__detail::__variant::
            __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:667:4)_&&,_std::variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>_&>
            ::_S_vtable._M_arr[(long)*(char *)(local_2c8._0_8_ + 0x20 + lVar8) + 1]._M_data)
                    ((anon_class_8_1_8991fb9c *)&local_388,
                     (variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                      *)(local_2c8._0_8_ + lVar8));
          uVar11 = uVar11 + 1;
          lVar13 = lVar13 + 8;
          lVar8 = lVar8 + 0x28;
        } while (lVar10 != lVar13);
      }
      this_02 = (_Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                 *)this;
      slang::ast::Statement::visit<netlist::ProceduralBlockVisitor&>(loop->body,this);
    } while (this->anyErrors == false);
  }
  slang::SmallVectorBase<slang::ConstantValue>::cleanup
            ((SmallVectorBase<slang::ConstantValue> *)&local_2c8,(EVP_PKEY_CTX *)this_02);
LAB_00177e83:
  if (local_358 != local_340) {
    operator_delete(local_358);
  }
  return;
}

Assistant:

void handle(const ast::ForLoopStatement& loop) {

        // Conditions that mean this loop cannot be unrolled.
        if (!options.unrollForLoops || loop.loopVars.empty() || !loop.stopExpr ||
            loop.steps.empty() || anyErrors) {
            loop.body.visit(*this);
            return;
        }

        // Attempt to unroll the loop. If we are unable to collect constant values
        // for all loop variables across all iterations, we won't unroll at all.
        auto handleFail = [&] {
            for (auto var : loop.loopVars) {
                evalCtx.deleteLocal(var);
            }
            loop.body.visit(*this);
        };

        // Create a list of the initialised loop variables.
        SmallVector<ConstantValue*> localPtrs;
        for (auto var : loop.loopVars) {
            auto init = var->getInitializer();
            if (!init) {
                handleFail();
                return;
            }

            auto cv = init->eval(evalCtx);
            if (!cv) {
                handleFail();
                return;
            }

            localPtrs.push_back(evalCtx.createLocal(var, std::move(cv)));
        }

        // Create a list of all the loop variable values across all iterations.
        SmallVector<ConstantValue, 16> values;
        while (true) {
            auto cv = step() ? loop.stopExpr->eval(evalCtx) : ConstantValue();
            if (!cv) {
                handleFail();
                return;
            }

            if (!cv.isTrue()) {
                break;
            }

            for (auto local : localPtrs) {
                values.emplace_back(*local);
            }

            for (auto step : loop.steps) {
                if (!step->eval(evalCtx)) {
                    handleFail();
                    return;
                }
            }
        }

        // We have all the loop iteration values. Go back through
        // and visit the loop body for each iteration.
        for (size_t i = 0; i < values.size();) {
            for (auto local : localPtrs) {
                *local = std::move(values[i++]);
            }

            loop.body.visit(*this);

            if (anyErrors) {
                return;
            }
        }
    }